

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::gjInverse(Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  float *pfVar10;
  undefined8 *puVar11;
  undefined4 *puVar12;
  uint uVar13;
  long lVar14;
  undefined8 *puVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [6];
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  Matrix44<float> s;
  
  pfVar10 = local_78;
  local_78[0] = 1.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 1.0;
  uStack_60 = 0;
  uStack_58 = 0;
  local_50 = 0x3f800000;
  uStack_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  s.x[0][0] = 0.0;
  s.x[0][1] = 1.0;
  puVar11 = &local_a8;
  local_b8 = *(undefined8 *)this->x[0];
  uStack_b0 = *(undefined8 *)(this->x[0] + 2);
  local_a8 = *(undefined8 *)this->x[1];
  uStack_a0 = *(undefined8 *)(this->x[1] + 2);
  local_98 = *(undefined8 *)this->x[2];
  uStack_90 = *(undefined8 *)(this->x[2] + 2);
  local_88 = *(undefined8 *)this->x[3];
  uStack_80 = *(undefined8 *)(this->x[3] + 2);
  uVar13 = 1;
  lVar14 = 0x30;
  puVar15 = &local_b8;
  uVar16 = 0;
  do {
    pfVar18 = (float *)(&local_b8 + uVar16 * 2);
    uVar1 = uVar16 + 1;
    fVar26 = pfVar18[uVar16];
    fVar23 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar23 = fVar26;
    }
    lVar19 = 0;
    uVar17 = uVar16 & 0xffffffff;
    uVar22 = uVar13;
    do {
      fVar26 = *(float *)((long)puVar11 + lVar19);
      fVar24 = -fVar26;
      if (-fVar26 <= fVar26) {
        fVar24 = fVar26;
      }
      uVar9 = (ulong)uVar22;
      if (fVar24 <= fVar23) {
        fVar24 = fVar23;
        uVar9 = uVar17;
      }
      uVar17 = uVar9;
      lVar19 = lVar19 + 0x10;
      uVar22 = uVar22 + 1;
      fVar23 = fVar24;
    } while (lVar14 != lVar19);
    if ((fVar24 == 0.0) && (!NAN(fVar24))) goto LAB_0015abcd;
    if (uVar16 != uVar17) {
      lVar19 = (long)(int)uVar17;
      lVar20 = 0;
      do {
        uVar4 = *(undefined4 *)((long)puVar15 + lVar20 * 4);
        *(undefined4 *)((long)puVar15 + lVar20 * 4) =
             *(undefined4 *)((long)&local_b8 + lVar20 * 4 + lVar19 * 0x10);
        *(undefined4 *)((long)&local_b8 + lVar20 * 4 + lVar19 * 0x10) = uVar4;
        fVar26 = pfVar10[lVar20];
        pfVar10[lVar20] = local_78[lVar19 * 4 + lVar20];
        local_78[lVar19 * 4 + lVar20] = fVar26;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
    }
    lVar19 = 0x10;
    uVar17 = uVar16;
    do {
      fVar25 = -*(float *)((long)puVar11 + lVar19 + -0x10) / pfVar18[uVar16];
      fVar26 = *(float *)((long)&local_b8 + uVar16 * 0x10 + 4);
      fVar23 = *(float *)(&uStack_b0 + uVar16 * 2);
      fVar24 = *(float *)((long)&uStack_b0 + uVar16 * 0x10 + 4);
      pfVar2 = (float *)((long)puVar15 + lVar19);
      fVar6 = pfVar2[1];
      fVar7 = pfVar2[2];
      fVar8 = pfVar2[3];
      pfVar3 = (float *)((long)puVar15 + lVar19);
      *pfVar3 = *pfVar18 * fVar25 + *pfVar2;
      pfVar3[1] = fVar26 * fVar25 + fVar6;
      pfVar3[2] = fVar23 * fVar25 + fVar7;
      pfVar3[3] = fVar24 * fVar25 + fVar8;
      fVar26 = local_78[uVar16 * 4 + 1];
      fVar23 = local_78[uVar16 * 4 + 2];
      fVar24 = local_78[uVar16 * 4 + 3];
      pfVar2 = (float *)((long)pfVar10 + lVar19);
      fVar6 = pfVar2[1];
      fVar7 = pfVar2[2];
      fVar8 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar10 + lVar19);
      *pfVar3 = fVar25 * local_78[uVar16 * 4] + *pfVar2;
      pfVar3[1] = fVar25 * fVar26 + fVar6;
      pfVar3[2] = fVar25 * fVar23 + fVar7;
      pfVar3[3] = fVar25 * fVar24 + fVar8;
      lVar19 = lVar19 + 0x10;
      uVar17 = uVar17 + 1;
    } while (uVar17 < 3);
    puVar11 = (undefined8 *)((long)puVar11 + 0x14);
    uVar13 = uVar13 + 1;
    lVar14 = lVar14 + -0x10;
    puVar15 = puVar15 + 2;
    pfVar10 = pfVar10 + 4;
    uVar16 = uVar1;
  } while (uVar1 != 3);
  if ((uStack_80._4_4_ != 0.0) || (NAN(uStack_80._4_4_))) {
    puVar11 = &local_88;
    puVar12 = &uStack_48;
    lVar14 = 3;
    fVar26 = uStack_80._4_4_;
    do {
      auVar27._4_4_ = fVar26;
      auVar27._0_4_ = fVar26;
      auVar27._8_4_ = fVar26;
      auVar27._12_4_ = fVar26;
      auVar27 = divps(*(undefined1 (*) [16])(&local_b8 + lVar14 * 2),auVar27);
      *(undefined1 (*) [16])(&local_b8 + lVar14 * 2) = auVar27;
      auVar5._4_4_ = fVar26;
      auVar5._0_4_ = fVar26;
      auVar5._8_4_ = fVar26;
      auVar5._12_4_ = fVar26;
      auVar27 = divps(*(undefined1 (*) [16])(local_78 + lVar14 * 4),auVar5);
      *(undefined1 (*) [16])(local_78 + lVar14 * 4) = auVar27;
      lVar19 = lVar14 + -1;
      if (lVar14 == 0) {
        *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(local_78[1],local_78[0]);
        *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(local_78[3],local_78[2]);
        *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(local_78[5],local_78[4]);
        *(undefined8 *)(__return_storage_ptr__->x[1] + 2) = uStack_60;
        *(undefined8 *)__return_storage_ptr__->x[2] = uStack_58;
        *(ulong *)(__return_storage_ptr__->x[2] + 2) = CONCAT44(uStack_4c,local_50);
        *(ulong *)__return_storage_ptr__->x[3] = CONCAT44(uStack_44,uStack_48);
        *(ulong *)(__return_storage_ptr__->x[3] + 2) = CONCAT44(s.x[0][1],s.x[0][0]);
        return __return_storage_ptr__;
      }
      lVar20 = 0;
      pfVar10 = local_78;
      puVar15 = &local_b8;
      do {
        fVar26 = -*(float *)((long)&local_b8 + lVar14 * 4 + lVar20 * 0x10);
        lVar21 = 0;
        do {
          fVar23 = *(float *)((long)puVar12 + lVar21);
          fVar24 = *(float *)((long)pfVar10 + lVar21);
          *(float *)((long)puVar15 + lVar21) =
               *(float *)((long)puVar11 + lVar21) * fVar26 + *(float *)((long)puVar15 + lVar21);
          *(float *)((long)pfVar10 + lVar21) = fVar23 * fVar26 + fVar24;
          lVar21 = lVar21 + 4;
        } while (lVar21 != 0x10);
        lVar20 = lVar20 + 1;
        puVar15 = puVar15 + 2;
        pfVar10 = pfVar10 + 4;
      } while (lVar20 != lVar14);
      fVar26 = *(float *)((long)&local_b8 + lVar19 * 0x14);
      puVar11 = puVar11 + -2;
      puVar12 = puVar12 + -4;
      lVar14 = lVar19;
    } while ((fVar26 != 0.0) || (NAN(fVar26)));
  }
LAB_0015abcd:
  __return_storage_ptr__->x[0][0] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  __return_storage_ptr__->x[1][1] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE inline Matrix44<T>
Matrix44<T>::gjInverse () const IMATH_NOEXCEPT
{
    int      i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0) { return Matrix44 (); }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t.x[i][i]) == 0) { return Matrix44 (); }

        for (j = 0; j < 4; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}